

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::StringProfiler::UintUintPair>
          (BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,UintUintPair *key)

{
  UintUintPair UVar1;
  Type piVar2;
  uint uVar3;
  int *piVar4;
  int extraout_EDX;
  int iVar5;
  Type this_00;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  
  piVar2 = this->buckets;
  if (piVar2 == (Type)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = GetBucket(this,(key->first * 2 | key->second << 0x11) + 1);
    piVar4 = piVar2 + uVar3;
    uVar3 = 0;
    iVar5 = extraout_EDX;
    while( true ) {
      iVar6 = *piVar4;
      lVar7 = (long)iVar6;
      if (lVar7 < 0) break;
      UVar1 = this->entries[lVar7].
              super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .
              super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
              .
              super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
              .
              super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
              .key;
      auVar8._0_4_ = -(uint)(UVar1.first == (*key).first);
      auVar8._4_4_ = -(uint)(UVar1.second == (*key).second);
      auVar8._8_4_ = 0xffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar8 = pmovsxdq(auVar8,auVar8);
      iVar5 = movmskpd(iVar5,auVar8);
      if (iVar5 == 3) {
        this_00 = this->stats;
        goto LAB_00bdbd81;
      }
      uVar3 = uVar3 + 1;
      piVar4 = &this->entries[lVar7].
                super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .
                super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                .
                super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .next;
    }
  }
  this_00 = this->stats;
  iVar6 = -1;
LAB_00bdbd81:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }